

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_parse.c
# Opt level: O0

ngx_int_t ngx_http_parse_set_cookie_lines(ngx_array_t *headers,ngx_str_t *name,ngx_str_t *value)

{
  void *pvVar1;
  u_char *s1;
  u_char *puVar2;
  ngx_int_t nVar3;
  bool bVar4;
  ngx_table_elt_t **h;
  u_char *end;
  u_char *last;
  u_char *start;
  ngx_uint_t i;
  ngx_str_t *value_local;
  ngx_str_t *name_local;
  ngx_array_t *headers_local;
  
  pvVar1 = headers->elts;
  start = (u_char *)0x0;
  do {
    if ((u_char *)headers->nelts <= start) {
      return -5;
    }
    if ((headers->pool->log->log_level & 0x100) != 0) {
      ngx_log_error_core(8,headers->pool->log,0,"parse header: \"%V: %V\"",
                         *(long *)((long)pvVar1 + (long)start * 8) + 8,
                         *(long *)((long)pvVar1 + (long)start * 8) + 0x18);
    }
    if (name->len < *(ulong *)(*(long *)((long)pvVar1 + (long)start * 8) + 0x18)) {
      s1 = *(u_char **)(*(long *)((long)pvVar1 + (long)start * 8) + 0x20);
      puVar2 = (u_char *)
               (*(long *)(*(long *)((long)pvVar1 + (long)start * 8) + 0x20) +
               *(long *)(*(long *)((long)pvVar1 + (long)start * 8) + 0x18));
      nVar3 = ngx_strncasecmp(s1,name->data,name->len);
      if (nVar3 == 0) {
        last = s1 + name->len;
        while( true ) {
          bVar4 = false;
          if (last < puVar2) {
            bVar4 = *last == ' ';
          }
          if (!bVar4) break;
          last = last + 1;
        }
        if ((last != puVar2) && (*last == '=')) {
          do {
            last = last + 1;
            bVar4 = false;
            if (last < puVar2) {
              bVar4 = *last == ' ';
            }
          } while (bVar4);
          end = last;
          while( true ) {
            bVar4 = false;
            if (end < puVar2) {
              bVar4 = *end != ';';
            }
            if (!bVar4) break;
            end = end + 1;
          }
          value->len = (long)end - (long)last;
          value->data = last;
          return (ngx_int_t)start;
        }
      }
    }
    start = start + 1;
  } while( true );
}

Assistant:

ngx_int_t
ngx_http_parse_set_cookie_lines(ngx_array_t *headers, ngx_str_t *name,
    ngx_str_t *value)
{
    ngx_uint_t         i;
    u_char            *start, *last, *end;
    ngx_table_elt_t  **h;

    h = headers->elts;

    for (i = 0; i < headers->nelts; i++) {

        ngx_log_debug2(NGX_LOG_DEBUG_HTTP, headers->pool->log, 0,
                       "parse header: \"%V: %V\"", &h[i]->key, &h[i]->value);

        if (name->len >= h[i]->value.len) {
            continue;
        }

        start = h[i]->value.data;
        end = h[i]->value.data + h[i]->value.len;

        if (ngx_strncasecmp(start, name->data, name->len) != 0) {
            continue;
        }

        for (start += name->len; start < end && *start == ' '; start++) {
            /* void */
        }

        if (start == end || *start++ != '=') {
            /* the invalid header value */
            continue;
        }

        while (start < end && *start == ' ') { start++; }

        for (last = start; last < end && *last != ';'; last++) {
            /* void */
        }

        value->len = last - start;
        value->data = start;

        return i;
    }

    return NGX_DECLINED;
}